

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O3

void __thiscall
CNetAddr::SerializeV2Stream<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
          (CNetAddr *this,ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *s)

{
  bool bVar1;
  size_t in_RCX;
  int __fd;
  long in_FS_OFFSET;
  uint8_t serialized [16];
  BIP155Network local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsInternal(this);
  __fd = (int)local_38;
  if (bVar1) {
    local_38[0] = IPV6;
    VectorWriter::write(s->m_substream,__fd,(void *)0x1,in_RCX);
    WriteCompactSize<ParamsStream<VectorWriter&,CNetAddr::SerParams>>(s,0x10);
    SerializeV1Array(this,(uint8_t (*) [16])local_38);
    VectorWriter::write(s->m_substream,__fd,(void *)0x10,in_RCX);
  }
  else {
    local_38[0] = GetBIP155Network(this);
    VectorWriter::write(s->m_substream,__fd,(void *)0x1,in_RCX);
    ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
              ((ParamsStream<VectorWriter&,CNetAddr::SerParams> *)s,&this->m_addr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV2Stream(Stream& s) const
    {
        if (IsInternal()) {
            // Serialize NET_INTERNAL as embedded in IPv6. We need to
            // serialize such addresses from addrman.
            s << static_cast<uint8_t>(BIP155Network::IPV6);
            s << COMPACTSIZE(ADDR_IPV6_SIZE);
            SerializeV1Stream(s);
            return;
        }

        s << static_cast<uint8_t>(GetBIP155Network());
        s << m_addr;
    }